

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

_Bool adt_u32Set_remove(adt_u32Set_t *self,uint32_t val)

{
  uint uVar1;
  adt_u32List_elem_t *pElem;
  
  if (self == (adt_u32Set_t *)0x0) {
    return false;
  }
  pElem = adt_u32List_iter_last(&self->list);
  if (pElem != (adt_u32List_elem_t *)0x0) {
    if (pElem->item == val) {
LAB_00106e88:
      adt_u32List_erase(&self->list,pElem);
      return true;
    }
    if (val < pElem->item) {
      for (pElem = adt_u32List_iter_first(&self->list); pElem != (adt_u32List_elem_t *)0x0;
          pElem = adt_u32List_iter_next(pElem)) {
        uVar1 = pElem->item;
        if (uVar1 == val) goto LAB_00106e88;
        if (val <= uVar1 && uVar1 != val) {
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool adt_u32Set_remove(adt_u32Set_t *self, uint32_t val)
{
   bool retval = false;
   if (self != 0)
   {
      adt_u32List_elem_t *iter = adt_u32List_iter_last(&self->list);
      if (iter != 0)
      {
         if ( val == iter->item )
         {
            retval = true;
         }
         else if (val < iter->item)
         {
            iter = adt_u32List_iter_first(&self->list);
            while (iter != 0)
            {
               if ( val == iter->item )
               {
                  retval = true;
                  break;
               }
               else if (val < iter->item)
               {
                  break;
               }
               iter = adt_u32List_iter_next(iter);
            }
         }
      }
      if (retval == true)
      {
         adt_u32List_erase(&self->list, iter);
      }
   }
   return retval;
}